

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorTest.cpp
# Opt level: O1

void relational_operator<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *t1,char *s1,vector<int,_std::allocator<int>_> *t2
               ,char *s2)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  bool bVar12;
  
  if (s1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c0c8);
  }
  else {
    sVar7 = strlen(s1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s1,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is...",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  piVar1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  sVar7 = (long)piVar2 - (long)piVar1;
  piVar3 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((sVar7 == (long)(t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3) &&
     ((piVar2 == piVar1 || (iVar6 = bcmp(piVar1,piVar3,sVar7), iVar6 == 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"equal to",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  piVar1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  sVar7 = (long)piVar2 - (long)piVar1;
  piVar3 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((sVar7 != (long)(t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3) ||
     ((piVar2 != piVar1 && (iVar6 = bcmp(piVar1,piVar3,sVar7), iVar6 != 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not equal to",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  piVar9 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar8 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar11 = (long)piVar5 - (long)piVar8;
  piVar10 = (int *)((long)piVar9 + lVar11);
  if ((long)piVar4 - (long)piVar9 <= lVar11) {
    piVar10 = piVar4;
  }
  for (; piVar10 != piVar9; piVar9 = piVar9 + 1) {
    if (*piVar8 != *piVar9) {
      bVar12 = *piVar9 < *piVar8;
      goto LAB_001061aa;
    }
    piVar8 = piVar8 + 1;
  }
  bVar12 = piVar8 != piVar5;
LAB_001061aa:
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"smaller than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  piVar9 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar8 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar11 = (long)piVar5 - (long)piVar8;
  piVar10 = (int *)((long)piVar9 + lVar11);
  if ((long)piVar4 - (long)piVar9 <= lVar11) {
    piVar10 = piVar4;
  }
  for (; piVar10 != piVar9; piVar9 = piVar9 + 1) {
    if (*piVar8 != *piVar9) {
      bVar12 = *piVar9 < *piVar8;
      goto LAB_00106237;
    }
    piVar8 = piVar8 + 1;
  }
  bVar12 = piVar8 != piVar5;
LAB_00106237:
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"smaller than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  piVar9 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar8 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar11 = (long)piVar5 - (long)piVar8;
  piVar10 = (int *)((long)piVar9 + lVar11);
  if ((long)piVar4 - (long)piVar9 <= lVar11) {
    piVar10 = piVar4;
  }
  for (; piVar10 != piVar9; piVar9 = piVar9 + 1) {
    if (*piVar8 != *piVar9) {
      bVar12 = *piVar9 < *piVar8;
      goto LAB_001062c4;
    }
    piVar8 = piVar8 + 1;
  }
  bVar12 = piVar8 != piVar5;
LAB_001062c4:
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"greater than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  piVar9 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar8 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar11 = (long)piVar5 - (long)piVar8;
  piVar10 = (int *)((long)piVar9 + lVar11);
  if ((long)piVar4 - (long)piVar9 <= lVar11) {
    piVar10 = piVar4;
  }
  do {
    if (piVar10 == piVar9) {
      bVar12 = piVar8 != piVar5;
LAB_00106351:
      if (!bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"greater than or equal to",0x18);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
      if (s2 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c0c8);
      }
      else {
        sVar7 = strlen(s2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s2,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      return;
    }
    if (*piVar8 != *piVar9) {
      bVar12 = *piVar9 < *piVar8;
      goto LAB_00106351;
    }
    piVar9 = piVar9 + 1;
    piVar8 = piVar8 + 1;
  } while( true );
}

Assistant:

void 	relational_operator(T const & t1, char const * s1, T const & t2, char const * s2) {
	std::cout << s1 << " is..." << std::endl;

	if (t1 == t2) std::cout << "equal to" << std::endl;
	if (t1 != t2) std::cout << "not equal to" << std::endl;
	if (t1 < t2) std::cout << "smaller than" << std::endl;
	if (t1 <= t2) std::cout << "smaller than or equal to" << std::endl;
	if (t1 > t2) std::cout << "greater than" << std::endl;
	if (t1 >= t2) std::cout << "greater than or equal to" << std::endl;

	std::cout << s2 << "!\n" << std::endl;
}